

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_from_range(uint64_t min,uint64_t max,uint32_t step)

{
  int iVar1;
  uint8_t uVar2;
  roaring_array_t *ra;
  ulong uVar3;
  uint uVar4;
  uint8_t type;
  uint8_t local_45;
  uint local_44;
  ulong local_40;
  void *local_38;
  
  uVar3 = 0x100000000;
  if (max < 0x100000000) {
    uVar3 = max;
  }
  if (min < uVar3 && step != 0) {
    ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
    if (step < 0x10000) {
      local_44 = step & 0xffff;
      local_40 = uVar3;
      do {
        uVar4 = (uint)min & 0xffff;
        uVar3 = local_40 - ((uint)min & 0xffff0000);
        if (0xffff < uVar3) {
          uVar3 = 0x10000;
        }
        local_38 = container_from_range(&local_45,uVar4,(uint32_t)uVar3,(uint16_t)local_44);
        uVar2 = local_45;
        extend_array(ra,1);
        iVar1 = ra->size;
        ra->keys[iVar1] = (uint16_t)(min >> 0x10);
        ra->containers[iVar1] = local_38;
        ra->typecodes[iVar1] = uVar2;
        ra->size = ra->size + 1;
        uVar4 = ~uVar4 + step + (uint32_t)uVar3;
        min = min + (uVar4 - uVar4 % step);
      } while (min < local_40);
    }
    else {
      uVar3 = min & 0xffffffff;
      while (uVar3 < max) {
        roaring_bitmap_add((roaring_bitmap_t *)ra,(uint32_t)min);
        min = (uint64_t)((uint32_t)min + step);
        uVar3 = min;
      }
    }
  }
  else {
    ra = (roaring_array_t *)0x0;
  }
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_from_range(uint64_t min, uint64_t max,
                                            uint32_t step) {
    if(max >= UINT64_C(0x100000000)) {
        max = UINT64_C(0x100000000);
    }
    if (step == 0) return NULL;
    if (max <= min) return NULL;
    roaring_bitmap_t *answer = roaring_bitmap_create();
    if (step >= (1 << 16)) {
        for (uint32_t value = (uint32_t)min; value < max; value += step) {
            roaring_bitmap_add(answer, value);
        }
        return answer;
    }
    uint64_t min_tmp = min;
    do {
        uint32_t key = (uint32_t)min_tmp >> 16;
        uint32_t container_min = min_tmp & 0xFFFF;
        uint32_t container_max = (uint32_t)minimum_uint64(max - (key << 16), 1 << 16);
        uint8_t type;
        container_t *container = container_from_range(&type, container_min,
                                               container_max, (uint16_t)step);
        ra_append(&answer->high_low_container, key, container, type);
        uint32_t gap = container_max - container_min + step - 1;
        min_tmp += gap - (gap % step);
    } while (min_tmp < max);
    // cardinality of bitmap will be ((uint64_t) max - min + step - 1 ) / step
    return answer;
}